

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

RootSymbol * __thiscall
slang::ast::Compilation::getRoot(Compilation *this,bool skipDefParamsAndBinds)

{
  flat_hash_map<std::tuple<std::string_view,_const_Scope_*>,_std::pair<std::vector<Symbol_*>,_bool>_>
  *h;
  flat_hash_map<std::string_view,_std::vector<const_ConfigBlockSymbol_*>_> *this_00;
  flat_hash_set<std::string_view> *pfVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  char *pcVar5;
  group_type_pointer pgVar6;
  group_type_pointer pgVar7;
  undefined4 uVar8;
  pointer pbVar9;
  _Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
  _Var10;
  group_type_pointer pgVar11;
  value_type_pointer ppVar12;
  pointer ppCVar13;
  ConfigBlockSymbol *this_01;
  group_type_pointer pgVar14;
  value_type_pointer ppVar15;
  Symbol *pSVar16;
  pointer ppSVar17;
  group_type_pointer pgVar18;
  value_type_pointer pbVar19;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __first;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __last;
  SyntaxNode *pSVar20;
  value_type_pointer ppVar21;
  Symbol *pSVar22;
  DefinitionSymbol *definition;
  pointer ppDVar23;
  pointer ppCVar24;
  pointer ppCVar25;
  uint uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  DefinitionLookupResult result;
  string_view arg;
  string_view arg_00;
  DefinitionLookupResult *pDVar30;
  group_type_pointer pgVar31;
  value_type_pointer ppVar32;
  bool bVar33;
  uint uVar34;
  int iVar35;
  pointer psVar36;
  size_type __n;
  uint64_t uVar37;
  Diagnostic *pDVar38;
  SourceLibrary *pSVar39;
  size_t sVar40;
  pointer ppSVar41;
  pointer pTVar42;
  ParameterDecl *pPVar43;
  flat_hash_map<OpaqueInstancePath::Entry,_HierarchyOverrideNode> *this_02;
  pointer ppVar44;
  HierarchyOverrideNode *hierarchyOverrideNode;
  InstanceSymbol *pIVar45;
  undefined4 extraout_var;
  Scope *pSVar46;
  ulong uVar47;
  ulong uVar48;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  size_t extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *libName;
  pointer pbVar49;
  pointer ppCVar50;
  long lVar51;
  pointer ppDVar52;
  ParameterDecl *pPVar53;
  ulong uVar54;
  long lVar55;
  pointer ppVar56;
  Compilation *ctx;
  ulong hash;
  ulong uVar57;
  value_type *elements;
  ulong uVar58;
  TopCell *cell;
  SourceLibrary *pSVar59;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __last_00;
  value_type_pointer __y;
  value_type_pointer __u;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __lasti;
  Scope *pSVar60;
  size_type sVar61;
  RootSymbol *pRVar62;
  pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange> *__i;
  pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange> *ppVar63;
  uchar uVar64;
  char cVar65;
  uchar uVar73;
  char cVar74;
  uchar uVar75;
  char cVar76;
  byte bVar77;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  byte bVar84;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  string_view sVar85;
  _Val_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp;
  _Val_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_00;
  basic_string_view<char,_std::char_traits<char>_> bVar86;
  span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL> sVar87;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_02;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_03;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_04;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_05;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_06;
  string_view local_2e8;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  pointer local_2b8;
  anon_class_24_3_d9e6786c tryAddTop;
  flat_hash_map<std::tuple<std::string_view,_const_Scope_*>,_std::pair<std::vector<Symbol_*>,_bool>_>
  *__range3;
  iterator __begin3;
  flat_hash_map<std::string_view,_const_ConstantValue_*> cliOverrides;
  iterator __begin3_1;
  SmallVector<const_slang::ast::InstanceSymbol_*,_5UL> topList;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  local_190;
  Symbol *local_150;
  undefined1 auStack_148 [16];
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  byte bStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  byte bStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  byte bStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  char local_128;
  char cStack_127;
  char cStack_126;
  byte bStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  byte bStack_121;
  char cStack_120;
  char cStack_11f;
  char cStack_11e;
  byte bStack_11d;
  char cStack_11c;
  char cStack_11b;
  char cStack_11a;
  byte bStack_119;
  uchar local_118;
  uchar uStack_117;
  uchar uStack_116;
  byte bStack_115;
  uchar uStack_114;
  uchar uStack_113;
  uchar uStack_112;
  byte bStack_111;
  uchar uStack_110;
  uchar uStack_10f;
  uchar uStack_10e;
  byte bStack_10d;
  uchar uStack_10c;
  uchar uStack_10b;
  uchar uStack_10a;
  byte bStack_109;
  uchar local_108;
  uchar uStack_107;
  uchar uStack_106;
  byte bStack_105;
  uchar uStack_104;
  uchar uStack_103;
  uchar uStack_102;
  byte bStack_101;
  uchar uStack_100;
  uchar uStack_ff;
  uchar uStack_fe;
  byte bStack_fd;
  uchar uStack_fc;
  uchar uStack_fb;
  uchar uStack_fa;
  byte bStack_f9;
  uchar local_f8;
  uchar uStack_f7;
  uchar uStack_f6;
  byte bStack_f5;
  uchar uStack_f4;
  uchar uStack_f3;
  uchar uStack_f2;
  byte bStack_f1;
  uchar uStack_f0;
  uchar uStack_ef;
  uchar uStack_ee;
  byte bStack_ed;
  uchar uStack_ec;
  uchar uStack_eb;
  uchar uStack_ea;
  byte bStack_e9;
  uchar local_e8;
  uchar uStack_e7;
  uchar uStack_e6;
  byte bStack_e5;
  uchar uStack_e4;
  uchar uStack_e3;
  uchar uStack_e2;
  byte bStack_e1;
  uchar uStack_e0;
  uchar uStack_df;
  uchar uStack_de;
  byte bStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  byte bStack_d9;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  byte bStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  byte bStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  byte bStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  uchar local_c8;
  uchar uStack_c7;
  uchar uStack_c6;
  uchar uStack_c5;
  uchar uStack_c4;
  uchar uStack_c3;
  uchar uStack_c2;
  uchar uStack_c1;
  uchar uStack_c0;
  uchar uStack_bf;
  uchar uStack_be;
  uchar uStack_bd;
  uchar uStack_bc;
  uchar uStack_bb;
  uchar uStack_ba;
  byte bStack_b9;
  uchar local_b8;
  uchar uStack_b7;
  uchar uStack_b6;
  uchar uStack_b5;
  uchar uStack_b4;
  uchar uStack_b3;
  uchar uStack_b2;
  uchar uStack_b1;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  uchar uStack_ad;
  uchar uStack_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  byte bStack_a9;
  uchar local_a8;
  uchar uStack_a7;
  uchar uStack_a6;
  uchar uStack_a5;
  uchar uStack_a4;
  uchar uStack_a3;
  uchar uStack_a2;
  uchar uStack_a1;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  uchar uStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  byte bStack_99;
  SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
  topDefs;
  
  if (this->finalized == true) {
    pRVar62 = (this->root)._M_t.
              super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
              .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  }
  else {
    std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>::
    reserve(&this->defaultLiblist,
            (long)(this->options).defaultLiblist.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->options).defaultLiblist.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
    pbVar9 = (this->options).defaultLiblist.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar49 = (this->options).defaultLiblist.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar49 != pbVar9;
        pbVar49 = pbVar49 + 1) {
      sVar85._M_str = (pbVar49->_M_dataplus)._M_p;
      sVar85._M_len = pbVar49->_M_string_length;
      topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.data_ =
           (pointer)getSourceLibrary(this,sVar85);
      if ((SourceLibrary *)topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.data_
          != (SourceLibrary *)0x0) {
        std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>::
        push_back(&this->defaultLiblist,(value_type *)&topList);
      }
    }
    boost::unordered::
    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
    ::unordered_flat_map(&cliOverrides);
    parseParamOverrides(this,&cliOverrides);
    if (!skipDefParamsAndBinds) {
      psVar36 = (this->syntaxTrees).
                super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (psVar36 ==
            (this->syntaxTrees).
            super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002a59c4;
        _Var10.super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl =
             (((psVar36->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->metadata)._M_t.
             super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
             .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>;
      } while ((*(char *)((long)_Var10.
                                super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>.
                                _M_head_impl + 0xd0) == '\0') &&
              (psVar36 = psVar36 + 1,
              *(char *)((long)_Var10.super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>.
                              _M_head_impl + 0xd1) != '\x01'));
      resolveDefParamsAndBinds(this);
    }
LAB_002a59c4:
    this->finalizing = true;
    topDefs.
    super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
    .data_ = (pointer)topDefs.
                      super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                      .firstElement;
    topDefs.
    super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
    .len = 0;
    topDefs.
    super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
    .cap = 2;
    if ((this->options).topModules.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size == 0) {
      tryAddTop._0_16_ =
           boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
           ::begin(&(this->definitionMap).table_);
      pfVar1 = &this->globalInstantiations;
      local_2c8._0_8_ = &this->unreferencedDefs;
      while (tryAddTop.topDefs !=
             (SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
              *)0x0) {
        pRVar62 = (this->root)._M_t.
                  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                  .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        pSVar46 = &pRVar62->super_Scope;
        if (pRVar62 == (RootSymbol *)0x0) {
          pSVar46 = (Scope *)0x0;
        }
        if ((((_Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               *)&((tryAddTop.topDefs)->
                  super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                  ).data_)->super__Tuple_impl<1UL,_const_slang::ast::Scope_*>).
            super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl == pSVar46) {
          ppSVar17 = (((pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
                        *)((tryAddTop.topDefs)->
                          super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                          ).firstElement)->first).
                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppSVar41 = (((pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
                             *)((tryAddTop.topDefs)->
                               super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                               ).firstElement)->first).
                          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppSVar41 != ppSVar17;
              ppSVar41 = ppSVar41 + 1) {
            pSVar16 = *ppSVar41;
            if ((pSVar16->kind == Definition) && (pSVar16[0xb].name._M_str[0x3c] == '\x01')) {
              uVar37 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)pfVar1,&pSVar16->name);
              uVar47 = uVar37 >> ((byte)(pfVar1->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                                        .arrays.groups_size_index & 0x3f);
              uVar8 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[uVar37 & 0xff];
              uVar54 = 0;
              do {
                pgVar18 = (this->globalInstantiations).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_;
                pgVar3 = pgVar18 + uVar47;
                local_e8 = pgVar3->m[0].n;
                uStack_e7 = pgVar3->m[1].n;
                uStack_e6 = pgVar3->m[2].n;
                bStack_e5 = pgVar3->m[3].n;
                uStack_e4 = pgVar3->m[4].n;
                uStack_e3 = pgVar3->m[5].n;
                uStack_e2 = pgVar3->m[6].n;
                bStack_e1 = pgVar3->m[7].n;
                uStack_e0 = pgVar3->m[8].n;
                uStack_df = pgVar3->m[9].n;
                uStack_de = pgVar3->m[10].n;
                bStack_dd = pgVar3->m[0xb].n;
                uStack_dc = pgVar3->m[0xc].n;
                uStack_db = pgVar3->m[0xd].n;
                uStack_da = pgVar3->m[0xe].n;
                bVar77 = pgVar3->m[0xf].n;
                uVar64 = (uchar)uVar8;
                auVar70[0] = -(local_e8 == uVar64);
                uVar73 = (uchar)((uint)uVar8 >> 8);
                auVar70[1] = -(uStack_e7 == uVar73);
                uVar75 = (uchar)((uint)uVar8 >> 0x10);
                auVar70[2] = -(uStack_e6 == uVar75);
                bVar84 = (byte)((uint)uVar8 >> 0x18);
                auVar70[3] = -(bStack_e5 == bVar84);
                auVar70[4] = -(uStack_e4 == uVar64);
                auVar70[5] = -(uStack_e3 == uVar73);
                auVar70[6] = -(uStack_e2 == uVar75);
                auVar70[7] = -(bStack_e1 == bVar84);
                auVar70[8] = -(uStack_e0 == uVar64);
                auVar70[9] = -(uStack_df == uVar73);
                auVar70[10] = -(uStack_de == uVar75);
                auVar70[0xb] = -(bStack_dd == bVar84);
                auVar70[0xc] = -(uStack_dc == uVar64);
                auVar70[0xd] = -(uStack_db == uVar73);
                auVar70[0xe] = -(uStack_da == uVar75);
                auVar70[0xf] = -(bVar77 == bVar84);
                uVar34 = (uint)(ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe);
                bStack_d9 = bVar77;
                if (uVar34 != 0) {
                  local_2d8._0_8_ = uVar54;
                  pbVar19 = (this->globalInstantiations).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.elements_;
                  do {
                    iVar35 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> iVar35 & 1) == 0; iVar35 = iVar35 + 1) {
                      }
                    }
                    bVar33 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                             operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)pfVar1,&pSVar16->name,
                                        (basic_string_view<char,_std::char_traits<char>_> *)
                                        ((long)&pbVar19[uVar47 * 0xf]._M_len +
                                        (ulong)(uint)(iVar35 << 4)));
                    if (bVar33) goto LAB_002a6704;
                    uVar34 = uVar34 - 1 & uVar34;
                  } while (uVar34 != 0);
                  bVar77 = pgVar18[uVar47].m[0xf].n;
                  uVar54 = local_2d8._0_8_;
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar37 & 7] & bVar77) == 0)
                break;
                uVar57 = (this->globalInstantiations).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_mask;
                lVar55 = uVar47 + uVar54;
                uVar54 = uVar54 + 1;
                uVar47 = lVar55 + 1U & uVar57;
              } while (uVar54 <= uVar57);
              pcVar5 = (char *)pSVar16[0xb].name._M_len;
              if (((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) &&
                 ((pSVar16[1].name._M_len & 0xfffffffd) == 0)) {
                pPVar53 = (ParameterDecl *)pSVar16[1].parentScope;
                pPVar43 = pPVar53 + (long)pSVar16[1].nextInScope;
                for (; pPVar53 != pPVar43; pPVar53 = pPVar53 + 1) {
                  bVar33 = DefinitionSymbol::ParameterDecl::hasDefault(pPVar53);
                  if (!bVar33) {
                    if (pPVar53->isTypeParam == false) {
                      uVar37 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                               operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                           *)&cliOverrides,&pPVar53->name);
                      uVar54 = uVar37 >> ((byte)cliOverrides.table_.
                                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                                .arrays.groups_size_index & 0x3f);
                      uVar8 = (&boost::unordered::detail::foa::
                                group15<boost::unordered::detail::foa::plain_integral>::
                                match_word(unsigned_long)::word)[uVar37 & 0xff];
                      ppVar56 = (pointer)0x0;
                      do {
                        ppVar32 = cliOverrides.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                  .arrays.elements_;
                        pgVar31 = cliOverrides.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                  .arrays.groups_;
                        pgVar7 = cliOverrides.table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                 .arrays.groups_ + uVar54;
                        local_f8 = pgVar7->m[0].n;
                        uStack_f7 = pgVar7->m[1].n;
                        uStack_f6 = pgVar7->m[2].n;
                        bStack_f5 = pgVar7->m[3].n;
                        uStack_f4 = pgVar7->m[4].n;
                        uStack_f3 = pgVar7->m[5].n;
                        uStack_f2 = pgVar7->m[6].n;
                        bStack_f1 = pgVar7->m[7].n;
                        uStack_f0 = pgVar7->m[8].n;
                        uStack_ef = pgVar7->m[9].n;
                        uStack_ee = pgVar7->m[10].n;
                        bStack_ed = pgVar7->m[0xb].n;
                        uStack_ec = pgVar7->m[0xc].n;
                        uStack_eb = pgVar7->m[0xd].n;
                        uStack_ea = pgVar7->m[0xe].n;
                        bVar77 = pgVar7->m[0xf].n;
                        uVar64 = (uchar)uVar8;
                        auVar71[0] = -(local_f8 == uVar64);
                        uVar73 = (uchar)((uint)uVar8 >> 8);
                        auVar71[1] = -(uStack_f7 == uVar73);
                        uVar75 = (uchar)((uint)uVar8 >> 0x10);
                        auVar71[2] = -(uStack_f6 == uVar75);
                        bVar84 = (byte)((uint)uVar8 >> 0x18);
                        auVar71[3] = -(bStack_f5 == bVar84);
                        auVar71[4] = -(uStack_f4 == uVar64);
                        auVar71[5] = -(uStack_f3 == uVar73);
                        auVar71[6] = -(uStack_f2 == uVar75);
                        auVar71[7] = -(bStack_f1 == bVar84);
                        auVar71[8] = -(uStack_f0 == uVar64);
                        auVar71[9] = -(uStack_ef == uVar73);
                        auVar71[10] = -(uStack_ee == uVar75);
                        auVar71[0xb] = -(bStack_ed == bVar84);
                        auVar71[0xc] = -(uStack_ec == uVar64);
                        auVar71[0xd] = -(uStack_eb == uVar73);
                        auVar71[0xe] = -(uStack_ea == uVar75);
                        auVar71[0xf] = -(bVar77 == bVar84);
                        uVar34 = (uint)(ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                                                (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                                                (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                                                (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                                                (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                                                (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                                                (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                                                (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                                                (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                                                (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                                                (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                                                (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                                                (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                                                (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe);
                        bStack_e9 = bVar77;
                        if (uVar34 != 0) {
                          do {
                            local_2b8 = ppVar56;
                            auVar70 = local_2d8;
                            local_2d8._4_4_ = 0;
                            local_2d8._0_4_ = uVar34;
                            local_2d8._8_8_ = auVar70._8_8_;
                            uVar26 = 0;
                            if (uVar34 != 0) {
                              for (; (uVar34 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                              }
                            }
                            bVar33 = std::
                                     equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     ::operator()((
                                                  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                                  *)&cliOverrides,&pPVar53->name,
                                                  &ppVar32[uVar54 * 0xf + (ulong)uVar26].first);
                            if (bVar33) goto LAB_002a659a;
                            uVar34 = local_2d8._0_4_ - 1 & local_2d8._0_4_;
                            ppVar56 = local_2b8;
                          } while (uVar34 != 0);
                          bVar77 = pgVar31[uVar54].m[0xf].n;
                        }
                        if (((&boost::unordered::detail::foa::
                               group15<boost::unordered::detail::foa::plain_integral>::
                               is_not_overflowed(unsigned_long)::shift)[(uint)uVar37 & 7] & bVar77)
                            == 0) break;
                        pDVar30 = &ppVar56->first;
                        ppVar56 = (pointer)((long)&(ppVar56->first).definition + 1);
                        uVar54 = (long)&pDVar30->definition + uVar54 + 1 &
                                 cliOverrides.table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                 .arrays.groups_size_mask;
                      } while (ppVar56 <=
                               cliOverrides.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                               .arrays.groups_size_mask);
                    }
                    goto LAB_002a66e5;
                  }
LAB_002a659a:
                }
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.len = 0;
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.cap = 0;
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.firstElement[0] =
                     '\0';
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.firstElement[1] =
                     '\0';
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.firstElement[2] =
                     '\0';
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.firstElement[3] =
                     '\0';
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.firstElement[4] =
                     '\0';
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.firstElement[5] =
                     '\0';
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.firstElement[6] =
                     '\0';
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.firstElement[7] =
                     '\0';
                topList.stackBase[0] = '\0';
                topList.stackBase[1] = '\0';
                topList.stackBase[2] = '\0';
                topList.stackBase[3] = '\0';
                topList.stackBase[4] = '\0';
                topList.stackBase[5] = '\0';
                topList.stackBase[6] = '\0';
                topList.stackBase[7] = '\0';
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.data_ =
                     (pointer)pSVar16;
                SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>>
                ::
                emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>>
                          ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>>
                            *)&topDefs,
                           (pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>
                            *)&topList);
              }
              else {
LAB_002a66e5:
                topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.data_ =
                     (pointer)pSVar16;
                std::
                vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                ::emplace_back<slang::ast::DefinitionSymbol_const*>
                          ((vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                            *)local_2c8._0_8_,(DefinitionSymbol **)&topList);
              }
            }
LAB_002a6704:
          }
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     *)&tryAddTop);
      }
    }
    else {
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
      ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                  *)&topList);
      tryAddTop.topDefs = &topDefs;
      tryAddTop.topNameMap =
           (SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
            *)&topList;
      tryAddTop.this = this;
      __begin3 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::begin(&(this->options).topModules.table_);
      h = &this->definitionMap;
      this_00 = &this->configBlocks;
      while (__begin3.p_ != (string_view *)0x0) {
        arg_00 = *__begin3.p_;
        arg = *__begin3.p_;
        local_2e8 = *__begin3.p_;
        sVar85 = *__begin3.p_;
        __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_2e8,'.',0);
        pSVar59 = (SourceLibrary *)0x0;
        if (__n == 0xffffffffffffffff) {
LAB_002a5ad7:
          bVar86._M_str = ":config";
          bVar86._M_len = 7;
          bVar33 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                             (&local_2e8,bVar86);
          if (bVar33) {
            local_2e8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                  (&local_2e8,0,
                                   (size_type)
                                   &(((table_element_pointer)(local_2e8._M_len + -0x38))->second).
                                    field_0x19);
          }
          else {
            pRVar62 = (this->root)._M_t.
                      super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                      .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
            __begin3_1.pc_ = (char_pointer)&pRVar62->super_Scope;
            if (pRVar62 == (RootSymbol *)0x0) {
              __begin3_1.pc_ = (char_pointer)0x0;
            }
            __begin3_1.p_ = (table_element_pointer)local_2e8._M_len;
            sVar40 = boost::unordered::detail::foa::mulx_mix::
                     mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                               ((hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
                                 *)h,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                      *)&__begin3_1);
            uVar54 = sVar40 >> ((byte)(h->table_).
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                                      .arrays.groups_size_index & 0x3f);
            uVar8 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[sVar40 & 0xff];
            auVar79._4_4_ = uVar8;
            auVar79._0_4_ = uVar8;
            auVar79._8_4_ = uVar8;
            auVar79._12_4_ = uVar8;
            uVar47 = 0;
            do {
              pgVar14 = (this->definitionMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                        .arrays.groups_;
              pgVar6 = pgVar14 + uVar54;
              local_a8 = pgVar6->m[0].n;
              uStack_a7 = pgVar6->m[1].n;
              uStack_a6 = pgVar6->m[2].n;
              uStack_a5 = pgVar6->m[3].n;
              uStack_a4 = pgVar6->m[4].n;
              uStack_a3 = pgVar6->m[5].n;
              uStack_a2 = pgVar6->m[6].n;
              uStack_a1 = pgVar6->m[7].n;
              uStack_a0 = pgVar6->m[8].n;
              uStack_9f = pgVar6->m[9].n;
              uStack_9e = pgVar6->m[10].n;
              uStack_9d = pgVar6->m[0xb].n;
              uStack_9c = pgVar6->m[0xc].n;
              uStack_9b = pgVar6->m[0xd].n;
              uStack_9a = pgVar6->m[0xe].n;
              bVar77 = pgVar6->m[0xf].n;
              auVar67[0] = -(local_a8 == auVar79[0]);
              auVar67[1] = -(uStack_a7 == auVar79[1]);
              auVar67[2] = -(uStack_a6 == auVar79[2]);
              auVar67[3] = -(uStack_a5 == auVar79[3]);
              auVar67[4] = -(uStack_a4 == auVar79[4]);
              auVar67[5] = -(uStack_a3 == auVar79[5]);
              auVar67[6] = -(uStack_a2 == auVar79[6]);
              auVar67[7] = -(uStack_a1 == auVar79[7]);
              auVar67[8] = -(uStack_a0 == auVar79[8]);
              auVar67[9] = -(uStack_9f == auVar79[9]);
              auVar67[10] = -(uStack_9e == auVar79[10]);
              auVar67[0xb] = -(uStack_9d == auVar79[0xb]);
              auVar67[0xc] = -(uStack_9c == auVar79[0xc]);
              auVar67[0xd] = -(uStack_9b == auVar79[0xd]);
              auVar67[0xe] = -(uStack_9a == auVar79[0xe]);
              auVar67[0xf] = -(bVar77 == auVar79[0xf]);
              uVar34 = (uint)(ushort)((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe);
              bStack_99 = bVar77;
              if (uVar34 != 0) {
                ppVar15 = (this->definitionMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                          .arrays.elements_;
                local_2c8._0_8_ = uVar54;
                local_2d8 = auVar79;
                do {
                  uVar26 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  __u = ppVar15 + uVar54 * 0xf + (ulong)uVar26;
                  bVar33 = std::
                           __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                           ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                   *)&__begin3_1,&__u->first);
                  if (bVar33) {
                    ppSVar41 = (__u->second).first.
                               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    goto LAB_002a5df7;
                  }
                  uVar34 = uVar34 - 1 & uVar34;
                } while (uVar34 != 0);
                bVar77 = pgVar14[uVar54].m[0xf].n;
                uVar54 = local_2c8._0_8_;
                auVar79 = local_2d8;
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)sVar40 & 7] & bVar77) == 0)
              break;
              uVar57 = (this->definitionMap).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                       .arrays.groups_size_mask;
              lVar55 = uVar54 + uVar47;
              uVar47 = uVar47 + 1;
              uVar54 = lVar55 + 1U & uVar57;
            } while (uVar47 <= uVar57);
          }
LAB_002a5b13:
          uVar37 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              this_00,&local_2e8);
          uVar54 = uVar37 >> ((byte)(this_00->table_).
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                                    .arrays.groups_size_index & 0x3f);
          uVar8 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar37 & 0xff];
          auVar78._4_4_ = uVar8;
          auVar78._0_4_ = uVar8;
          auVar78._8_4_ = uVar8;
          auVar78._12_4_ = uVar8;
          uVar47 = 0;
          do {
            pgVar11 = (this->configBlocks).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                      .arrays.groups_;
            pgVar2 = pgVar11 + uVar54;
            local_c8 = pgVar2->m[0].n;
            uStack_c7 = pgVar2->m[1].n;
            uStack_c6 = pgVar2->m[2].n;
            uStack_c5 = pgVar2->m[3].n;
            uStack_c4 = pgVar2->m[4].n;
            uStack_c3 = pgVar2->m[5].n;
            uStack_c2 = pgVar2->m[6].n;
            uStack_c1 = pgVar2->m[7].n;
            uStack_c0 = pgVar2->m[8].n;
            uStack_bf = pgVar2->m[9].n;
            uStack_be = pgVar2->m[10].n;
            uStack_bd = pgVar2->m[0xb].n;
            uStack_bc = pgVar2->m[0xc].n;
            uStack_bb = pgVar2->m[0xd].n;
            uStack_ba = pgVar2->m[0xe].n;
            bVar77 = pgVar2->m[0xf].n;
            auVar66[0] = -(local_c8 == auVar78[0]);
            auVar66[1] = -(uStack_c7 == auVar78[1]);
            auVar66[2] = -(uStack_c6 == auVar78[2]);
            auVar66[3] = -(uStack_c5 == auVar78[3]);
            auVar66[4] = -(uStack_c4 == auVar78[4]);
            auVar66[5] = -(uStack_c3 == auVar78[5]);
            auVar66[6] = -(uStack_c2 == auVar78[6]);
            auVar66[7] = -(uStack_c1 == auVar78[7]);
            auVar66[8] = -(uStack_c0 == auVar78[8]);
            auVar66[9] = -(uStack_bf == auVar78[9]);
            auVar66[10] = -(uStack_be == auVar78[10]);
            auVar66[0xb] = -(uStack_bd == auVar78[0xb]);
            auVar66[0xc] = -(uStack_bc == auVar78[0xc]);
            auVar66[0xd] = -(uStack_bb == auVar78[0xd]);
            auVar66[0xe] = -(uStack_ba == auVar78[0xe]);
            auVar66[0xf] = -(bVar77 == auVar78[0xf]);
            uVar34 = (uint)(ushort)((ushort)(SUB161(auVar66 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe);
            bStack_b9 = bVar77;
            if (uVar34 != 0) {
              ppVar12 = (this->configBlocks).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                        .arrays.elements_;
              local_2c8._0_8_ = uVar54;
              local_2d8 = auVar78;
              do {
                uVar26 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                __y = ppVar12 + uVar54 * 0xf + (ulong)uVar26;
                bVar33 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)this_00,&local_2e8,&__y->first);
                if (bVar33) {
                  ppCVar50 = (__y->second).
                             super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  ppCVar13 = (__y->second).
                             super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  goto LAB_002a5c6f;
                }
                uVar34 = uVar34 - 1 & uVar34;
              } while (uVar34 != 0);
              bVar77 = pgVar11[uVar54].m[0xf].n;
              uVar54 = local_2c8._0_8_;
              auVar78 = local_2d8;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar37 & 7] & bVar77) == 0) break;
            uVar57 = (this->configBlocks).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                     .arrays.groups_size_mask;
            lVar55 = uVar54 + uVar47;
            uVar47 = uVar47 + 1;
            uVar54 = lVar55 + 1U & uVar57;
          } while (uVar47 <= uVar57);
LAB_002a5c27:
          pDVar38 = Scope::addDiag(&((this->root)._M_t.
                                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                    _M_head_impl)->super_Scope,(DiagCode)0x10000d,
                                   (SourceLocation)0xffffffffffffffff);
          Diagnostic::operator<<(pDVar38,arg);
        }
        else {
          bVar86 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_2e8,0,__n);
          pSVar59 = getSourceLibrary(this,bVar86);
          if (pSVar59 != (SourceLibrary *)0x0) {
            local_2e8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                  (&local_2e8,__n + 1,0xffffffffffffffff);
            goto LAB_002a5ad7;
          }
          pDVar38 = Scope::addDiag(&((this->root)._M_t.
                                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                    _M_head_impl)->super_Scope,(DiagCode)0x10000d,
                                   (SourceLocation)0xffffffffffffffff);
          Diagnostic::operator<<(pDVar38,sVar85);
        }
LAB_002a608b:
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::increment(&__begin3);
      }
      __begin3_1 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                   ::begin(&h->table_);
      pfVar1 = &this->globalInstantiations;
      local_2c8._0_8_ = &this->unreferencedDefs;
      while (__begin3_1.p_ != (table_element_pointer)0x0) {
        pRVar62 = (this->root)._M_t.
                  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                  .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        pSVar46 = &pRVar62->super_Scope;
        if (pRVar62 == (RootSymbol *)0x0) {
          pSVar46 = (Scope *)0x0;
        }
        if (((__begin3_1.p_)->first).
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
            super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl == pSVar46) {
          ppSVar17 = ((__begin3_1.p_)->second).first.
                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppSVar41 = ((__begin3_1.p_)->second).first.
                          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppSVar41 != ppSVar17;
              ppSVar41 = ppSVar41 + 1) {
            pSVar16 = *ppSVar41;
            if (pSVar16->kind == Definition) {
              uVar37 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)pfVar1,&pSVar16->name);
              uVar47 = uVar37 >> ((byte)(pfVar1->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                                        .arrays.groups_size_index & 0x3f);
              uVar8 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[uVar37 & 0xff];
              uVar54 = 0;
              do {
                pgVar18 = (this->globalInstantiations).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_;
                pgVar3 = pgVar18 + uVar47;
                local_d8 = pgVar3->m[0].n;
                uStack_d7 = pgVar3->m[1].n;
                uStack_d6 = pgVar3->m[2].n;
                bStack_d5 = pgVar3->m[3].n;
                uStack_d4 = pgVar3->m[4].n;
                uStack_d3 = pgVar3->m[5].n;
                uStack_d2 = pgVar3->m[6].n;
                bStack_d1 = pgVar3->m[7].n;
                uStack_d0 = pgVar3->m[8].n;
                uStack_cf = pgVar3->m[9].n;
                uStack_ce = pgVar3->m[10].n;
                bStack_cd = pgVar3->m[0xb].n;
                uStack_cc = pgVar3->m[0xc].n;
                uStack_cb = pgVar3->m[0xd].n;
                uStack_ca = pgVar3->m[0xe].n;
                bVar77 = pgVar3->m[0xf].n;
                uVar64 = (uchar)uVar8;
                auVar69[0] = -(local_d8 == uVar64);
                uVar73 = (uchar)((uint)uVar8 >> 8);
                auVar69[1] = -(uStack_d7 == uVar73);
                uVar75 = (uchar)((uint)uVar8 >> 0x10);
                auVar69[2] = -(uStack_d6 == uVar75);
                bVar84 = (byte)((uint)uVar8 >> 0x18);
                auVar69[3] = -(bStack_d5 == bVar84);
                auVar69[4] = -(uStack_d4 == uVar64);
                auVar69[5] = -(uStack_d3 == uVar73);
                auVar69[6] = -(uStack_d2 == uVar75);
                auVar69[7] = -(bStack_d1 == bVar84);
                auVar69[8] = -(uStack_d0 == uVar64);
                auVar69[9] = -(uStack_cf == uVar73);
                auVar69[10] = -(uStack_ce == uVar75);
                auVar69[0xb] = -(bStack_cd == bVar84);
                auVar69[0xc] = -(uStack_cc == uVar64);
                auVar69[0xd] = -(uStack_cb == uVar73);
                auVar69[0xe] = -(uStack_ca == uVar75);
                auVar69[0xf] = -(bVar77 == bVar84);
                uVar34 = (uint)(ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe);
                bStack_c9 = bVar77;
                if (uVar34 != 0) {
                  local_2d8._0_8_ = uVar54;
                  pbVar19 = (this->globalInstantiations).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.elements_;
                  do {
                    iVar35 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> iVar35 & 1) == 0; iVar35 = iVar35 + 1) {
                      }
                    }
                    bVar33 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                             operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)pfVar1,&pSVar16->name,
                                        (basic_string_view<char,_std::char_traits<char>_> *)
                                        ((long)&pbVar19[uVar47 * 0xf]._M_len +
                                        (ulong)(uint)(iVar35 << 4)));
                    if (bVar33) goto LAB_002a62d0;
                    uVar34 = uVar34 - 1 & uVar34;
                  } while (uVar34 != 0);
                  bVar77 = pgVar18[uVar47].m[0xf].n;
                  uVar54 = local_2d8._0_8_;
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar37 & 7] & bVar77) == 0)
                break;
                uVar57 = (this->globalInstantiations).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_mask;
                lVar55 = uVar47 + uVar54;
                uVar54 = uVar54 + 1;
                uVar47 = lVar55 + 1U & uVar57;
              } while (uVar54 <= uVar57);
              if ((pSVar16[0xb].name._M_str[0x3c] == '\x01') &&
                 (pSVar16[0xb].parentScope == (Scope *)0x0)) {
                __begin3.pc_ = (char_pointer)pSVar16;
                std::
                vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                ::emplace_back<slang::ast::DefinitionSymbol_const*>
                          ((vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                            *)local_2c8._0_8_,(DefinitionSymbol **)&__begin3);
              }
            }
LAB_002a62d0:
          }
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::increment(&__begin3_1);
      }
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
      ::~table_core(&local_190);
    }
    sVar61 = topDefs.
             super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
             .len;
    ppVar56 = topDefs.
              super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
              .data_;
    if (topDefs.
        super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
        .len != 0) {
      lVar51 = topDefs.
               super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
               .len * 0x28;
      ppVar63 = topDefs.
                super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                .data_ + topDefs.
                         super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                         .len;
      lVar55 = 0x3f;
      if (topDefs.
          super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
          .len != 0) {
        for (; topDefs.
               super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
               .len >> lVar55 == 0; lVar55 = lVar55 + -1) {
        }
      }
      __comp_05._M_comp.__proj = (identity *)&tryAddTop;
      __comp_05._M_comp.__comp = (less *)&topList;
      std::
      __introsort_loop<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (topDefs.
                 super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                 .data_,ppVar63,(ulong)(((uint)lVar55 ^ 0x3f) * 2) ^ 0x7e,__comp_05);
      if ((long)sVar61 < 0x11) {
        __comp_02._M_comp.__proj = (identity *)&tryAddTop;
        __comp_02._M_comp.__comp = (less *)&topList;
        std::
        __insertion_sort<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (ppVar56,ppVar63,__comp_02);
      }
      else {
        ppVar63 = ppVar56 + 0x10;
        __comp_01._M_comp.__proj = (identity *)&tryAddTop;
        __comp_01._M_comp.__comp = (less *)&topList;
        std::
        __insertion_sort<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (ppVar56,ppVar63,__comp_01);
        for (lVar51 = lVar51 + -0x280; lVar51 != 0; lVar51 = lVar51 + -0x28) {
          __comp._M_comp.__proj = (identity *)&tryAddTop;
          __comp._M_comp.__comp = (less *)&topList;
          std::
          __unguarded_linear_insert<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,__gnu_cxx::__ops::_Val_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                    (ppVar63,__comp);
          ppVar63 = ppVar63 + 1;
        }
      }
    }
    __first._M_current =
         (this->unreferencedDefs).
         super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->unreferencedDefs).
         super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar54 = (long)__last._M_current - (long)__first._M_current >> 3;
      lVar55 = 0x3f;
      if (uVar54 != 0) {
        for (; uVar54 >> lVar55 == 0; lVar55 = lVar55 + -1) {
        }
      }
      __comp_06._M_comp.__proj = (identity *)&tryAddTop;
      __comp_06._M_comp.__comp = (less *)&topList;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (__first,__last,(ulong)(((uint)lVar55 ^ 0x3f) * 2) ^ 0x7e,__comp_06);
      if ((long)__last._M_current - (long)__first._M_current < 0x81) {
        __comp_04._M_comp.__proj = (identity *)&tryAddTop;
        __comp_04._M_comp.__comp = (less *)&topList;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (__first,__last,__comp_04);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        __comp_03._M_comp.__proj = (identity *)&tryAddTop;
        __comp_03._M_comp.__comp = (less *)&topList;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (__first,__last_00,__comp_03);
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          __comp_00._M_comp.__proj = (identity *)&tryAddTop;
          __comp_00._M_comp.__comp = (less *)&topList;
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                    (__last_00,__comp_00);
        }
      }
    }
    if (cliOverrides.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
        .size_ctrl.size != 0) {
      local_2b8 = topDefs.
                  super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                  .data_ + topDefs.
                           super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                           .len;
      this_02 = &(this->hierarchyOverrides).childNodes;
      ppVar56 = topDefs.
                super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                .data_;
      while (ppVar56 != local_2b8) {
        local_2c8._0_8_ = ppVar56;
        pSVar16 = (ppVar56->first).definition;
        pSVar46 = pSVar16[1].parentScope;
        pSVar60 = (Scope *)((long)pSVar16[1].nextInScope * 0x40 + (long)pSVar46);
LAB_002a6870:
        if (pSVar46 != pSVar60) {
          if ((*(char *)&pSVar46[1].compilation == '\0') &&
             (*(char *)((long)&pSVar46[1].compilation + 3) == '\x01')) {
            uVar37 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&cliOverrides,
                                (basic_string_view<char,_std::char_traits<char>_> *)
                                &pSVar46->nameMap);
            uVar47 = uVar37 >> ((byte)cliOverrides.table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                      .arrays.groups_size_index & 0x3f);
            uVar8 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar37 & 0xff];
            uVar54 = 0;
            do {
              ppVar32 = cliOverrides.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                        .arrays.elements_;
              pgVar31 = cliOverrides.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                        .arrays.groups_;
              pgVar7 = cliOverrides.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                       .arrays.groups_ + uVar47;
              local_108 = pgVar7->m[0].n;
              uStack_107 = pgVar7->m[1].n;
              uStack_106 = pgVar7->m[2].n;
              bStack_105 = pgVar7->m[3].n;
              uStack_104 = pgVar7->m[4].n;
              uStack_103 = pgVar7->m[5].n;
              uStack_102 = pgVar7->m[6].n;
              bStack_101 = pgVar7->m[7].n;
              uStack_100 = pgVar7->m[8].n;
              uStack_ff = pgVar7->m[9].n;
              uStack_fe = pgVar7->m[10].n;
              bStack_fd = pgVar7->m[0xb].n;
              uStack_fc = pgVar7->m[0xc].n;
              uStack_fb = pgVar7->m[0xd].n;
              uStack_fa = pgVar7->m[0xe].n;
              bVar77 = pgVar7->m[0xf].n;
              uVar64 = (uchar)uVar8;
              auVar72[0] = -(local_108 == uVar64);
              uVar73 = (uchar)((uint)uVar8 >> 8);
              auVar72[1] = -(uStack_107 == uVar73);
              uVar75 = (uchar)((uint)uVar8 >> 0x10);
              auVar72[2] = -(uStack_106 == uVar75);
              bVar84 = (byte)((uint)uVar8 >> 0x18);
              auVar72[3] = -(bStack_105 == bVar84);
              auVar72[4] = -(uStack_104 == uVar64);
              auVar72[5] = -(uStack_103 == uVar73);
              auVar72[6] = -(uStack_102 == uVar75);
              auVar72[7] = -(bStack_101 == bVar84);
              auVar72[8] = -(uStack_100 == uVar64);
              auVar72[9] = -(uStack_ff == uVar73);
              auVar72[10] = -(uStack_fe == uVar75);
              auVar72[0xb] = -(bStack_fd == bVar84);
              auVar72[0xc] = -(uStack_fc == uVar64);
              auVar72[0xd] = -(uStack_fb == uVar73);
              auVar72[0xe] = -(uStack_fa == uVar75);
              auVar72[0xf] = -(bVar77 == bVar84);
              uVar34 = (uint)(ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe);
              bStack_f9 = bVar77;
              if (uVar34 != 0) {
                local_2d8._0_8_ = uVar54;
                do {
                  uVar26 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  bVar33 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                           operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)&cliOverrides,
                                      (basic_string_view<char,_std::char_traits<char>_> *)
                                      &pSVar46->nameMap,&ppVar32[uVar47 * 0xf + (ulong)uVar26].first
                                     );
                  if (bVar33) {
                    pSVar20 = pSVar16->originatingSyntax;
                    __begin3.pc_ = (char_pointer)pSVar20;
                    auVar27._8_8_ = 0;
                    auVar27._0_8_ = pSVar20;
                    hash = SUB168(auVar27 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                           SUB168(auVar27 * ZEXT816(0x9e3779b97f4a7c15),0);
                    uVar48 = hash >> ((byte)(this->hierarchyOverrides).childNodes.table_.
                                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                            .arrays.groups_size_index & 0x3f);
                    uVar8 = (&boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              match_word(unsigned_long)::word)[hash & 0xff];
                    ppVar21 = (this->hierarchyOverrides).childNodes.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                              .arrays.elements_;
                    uVar54 = (this->hierarchyOverrides).childNodes.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                             .arrays.groups_size_mask;
                    uVar58 = 0;
                    uVar57 = uVar48;
                    goto LAB_002a6a36;
                  }
                  uVar34 = uVar34 - 1 & uVar34;
                } while (uVar34 != 0);
                bVar77 = pgVar31[uVar47].m[0xf].n;
                uVar54 = local_2d8._0_8_;
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar37 & 7] & bVar77) == 0)
              break;
              lVar55 = uVar47 + uVar54;
              uVar54 = uVar54 + 1;
              uVar47 = lVar55 + 1U &
                       cliOverrides.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                       .arrays.groups_size_mask;
            } while (uVar54 <= cliOverrides.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                               .arrays.groups_size_mask);
          }
          goto LAB_002a6c38;
        }
        ppVar56 = (pointer)(local_2c8._0_8_ + 0x28);
      }
    }
    topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.data_ =
         (pointer)topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.firstElement;
    topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>._8_16_ = ZEXT816(5) << 0x40;
    ppVar44 = topDefs.
              super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
              .data_ + topDefs.
                       super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                       .len;
    for (ppVar56 = topDefs.
                   super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                   .data_; ppVar56 != ppVar44; ppVar56 = ppVar56 + 1) {
      definition = (DefinitionSymbol *)(ppVar56->first).definition;
      pSVar20 = (definition->super_Symbol).originatingSyntax;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = pSVar20;
      uVar47 = SUB168(auVar29 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar29 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar57 = uVar47 >> ((byte)(this->hierarchyOverrides).childNodes.table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                .arrays.groups_size_index & 0x3f);
      uVar8 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar47 & 0xff];
      ppVar21 = (this->hierarchyOverrides).childNodes.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                .arrays.elements_;
      uVar54 = (this->hierarchyOverrides).childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
               .arrays.groups_size_mask;
      uVar48 = 0;
      do {
        pgVar4 = (this->hierarchyOverrides).childNodes.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 .arrays.groups_ + uVar57;
        local_138 = pgVar4->m[0].n;
        uStack_137 = pgVar4->m[1].n;
        uStack_136 = pgVar4->m[2].n;
        bStack_135 = pgVar4->m[3].n;
        uStack_134 = pgVar4->m[4].n;
        uStack_133 = pgVar4->m[5].n;
        uStack_132 = pgVar4->m[6].n;
        bStack_131 = pgVar4->m[7].n;
        uStack_130 = pgVar4->m[8].n;
        uStack_12f = pgVar4->m[9].n;
        uStack_12e = pgVar4->m[10].n;
        bStack_12d = pgVar4->m[0xb].n;
        uStack_12c = pgVar4->m[0xc].n;
        uStack_12b = pgVar4->m[0xd].n;
        uStack_12a = pgVar4->m[0xe].n;
        bStack_129 = pgVar4->m[0xf].n;
        uVar64 = (uchar)uVar8;
        auVar83[0] = -(local_138 == uVar64);
        uVar73 = (uchar)((uint)uVar8 >> 8);
        auVar83[1] = -(uStack_137 == uVar73);
        uVar75 = (uchar)((uint)uVar8 >> 0x10);
        auVar83[2] = -(uStack_136 == uVar75);
        bVar77 = (byte)((uint)uVar8 >> 0x18);
        auVar83[3] = -(bStack_135 == bVar77);
        auVar83[4] = -(uStack_134 == uVar64);
        auVar83[5] = -(uStack_133 == uVar73);
        auVar83[6] = -(uStack_132 == uVar75);
        auVar83[7] = -(bStack_131 == bVar77);
        auVar83[8] = -(uStack_130 == uVar64);
        auVar83[9] = -(uStack_12f == uVar73);
        auVar83[10] = -(uStack_12e == uVar75);
        auVar83[0xb] = -(bStack_12d == bVar77);
        auVar83[0xc] = -(uStack_12c == uVar64);
        auVar83[0xd] = -(uStack_12b == uVar73);
        auVar83[0xe] = -(uStack_12a == uVar75);
        auVar83[0xf] = -(bStack_129 == bVar77);
        for (uVar34 = (uint)(ushort)((ushort)(SUB161(auVar83 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar83 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar83 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar83 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar83 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar83 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar83 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar83 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar83 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar83 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar83 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar83 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar83 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar83 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar83 >> 0x77,0) & 1) << 0xe); uVar34 != 0;
            uVar34 = uVar34 - 1 & uVar34) {
          iVar35 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> iVar35 & 1) == 0; iVar35 = iVar35 + 1) {
            }
          }
          if (*(SyntaxNode **)
               ((long)&ppVar21[uVar57 * 0xf].first.value + (ulong)(uint)(iVar35 << 7)) == pSVar20) {
            hierarchyOverrideNode =
                 (HierarchyOverrideNode *)
                 ((long)&ppVar21[uVar57 * 0xf].second.paramOverrides.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                         .arrays.groups_size_index + (ulong)(uint)(iVar35 << 7));
            goto LAB_002a6dcb;
          }
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar47 & 7] & bStack_129) == 0)
        break;
        lVar55 = uVar57 + uVar48;
        uVar48 = uVar48 + 1;
        uVar57 = lVar55 + 1U & uVar54;
      } while (uVar48 <= uVar54);
      hierarchyOverrideNode = (HierarchyOverrideNode *)0x0;
LAB_002a6dcb:
      pIVar45 = InstanceSymbol::createDefault
                          (this,definition,hierarchyOverrideNode,(ppVar56->first).configRoot,
                           (ppVar56->first).configRule,(SourceLocation)0x0);
      Scope::addMember(&((this->root)._M_t.
                         super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                         .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                        super_Scope,(Symbol *)pIVar45);
      tryAddTop.topNameMap =
           (SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
            *)pIVar45;
      SmallVectorBase<slang::ast::InstanceSymbol_const*>::
      emplace_back<slang::ast::InstanceSymbol_const*>
                ((SmallVectorBase<slang::ast::InstanceSymbol_const*> *)&topList,
                 (InstanceSymbol **)&tryAddTop);
    }
    if ((((this->options).flags.m_bits & 0x50) == 0) &&
       (topDefs.
        super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
        .len == 0)) {
      Scope::addDiag(&((this->root)._M_t.
                       super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                       .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                      super_Scope,(DiagCode)0x2a000d,(SourceLocation)0xffffffffffffffff);
      ppVar56 = extraout_RDX;
    }
    ppDVar23 = (this->unreferencedDefs).
               super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (ppDVar52 = (this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppDVar52 != ppDVar23;
        ppDVar52 = ppDVar52 + 1) {
      pRVar62 = (this->root)._M_t.
                super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
      pIVar45 = InstanceSymbol::createInvalid(this,*ppDVar52);
      Scope::addMember(&pRVar62->super_Scope,(Symbol *)pIVar45);
      ppVar56 = extraout_RDX_00;
    }
    ctx = this;
    iVar35 = SmallVectorBase<const_slang::ast::InstanceSymbol_*>::copy
                       (&topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>,
                        (EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)ppVar56);
    pRVar62 = (this->root)._M_t.
              super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
              .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    (pRVar62->topInstances)._M_ptr = (pointer)CONCAT44(extraout_var,iVar35);
    (pRVar62->topInstances)._M_extent._M_extent_value = extraout_RDX_01;
    ppCVar24 = (this->compilationUnits).
               super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppCVar25 = (this->compilationUnits).
               super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pRVar62 = (this->root)._M_t.
              super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
              .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    (pRVar62->compilationUnits)._M_ptr = ppCVar24;
    (pRVar62->compilationUnits)._M_extent._M_extent_value = (long)ppCVar25 - (long)ppCVar24 >> 3;
    this->finalized = true;
    this->finalizing = false;
    pRVar62 = (this->root)._M_t.
              super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
              .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    SmallVectorBase<const_slang::ast::InstanceSymbol_*>::cleanup
              (&topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>,
               (EVP_PKEY_CTX *)ctx);
    SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
    ::cleanup(&topDefs.
               super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
              ,(EVP_PKEY_CTX *)ctx);
    this->finalizing = false;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                   *)&cliOverrides);
  }
  return pRVar62;
LAB_002a5df7:
  if (ppSVar41 ==
      (__u->second).first.
      super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_002a5b13;
  pSVar16 = *ppSVar41;
  if ((pSVar16->kind == Definition) &&
     ((pSVar39 = (SourceLibrary *)pSVar16[0xb].name._M_str, pSVar39 == pSVar59 ||
      ((pSVar59 == (SourceLibrary *)0x0 && (pSVar39->isDefault != false)))))) {
    if ((pSVar16[1].name._M_len & 0xfffffffd) != 0) goto LAB_002a605c;
    pPVar53 = (ParameterDecl *)pSVar16[1].parentScope;
    local_2d8._0_8_ = pPVar53 + (long)pSVar16[1].nextInScope;
    goto LAB_002a5f02;
  }
  ppSVar41 = ppSVar41 + 1;
  goto LAB_002a5df7;
LAB_002a5f02:
  if (pPVar53 == (ParameterDecl *)local_2d8._0_8_) {
    auStack_148 = (undefined1  [16])0x0;
    local_150 = pSVar16;
    getRoot::anon_class_24_3_d9e6786c::operator()
              (&tryAddTop,(DefinitionLookupResult)ZEXT824(pSVar16),(SourceRange)ZEXT816(0));
  }
  else {
    bVar33 = DefinitionSymbol::ParameterDecl::hasDefault(pPVar53);
    if (bVar33) goto LAB_002a5f23;
    if (pPVar53->isTypeParam == false) {
      uVar37 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &cliOverrides,&pPVar53->name);
      ppVar56 = (pointer)(uVar37 >>
                         ((byte)cliOverrides.table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                .arrays.groups_size_index & 0x3f));
      uVar8 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar37 & 0xff];
      auVar80._4_4_ = uVar8;
      auVar80._0_4_ = uVar8;
      auVar80._8_4_ = uVar8;
      auVar80._12_4_ = uVar8;
      uVar54 = 0;
      do {
        ppVar32 = cliOverrides.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                  .arrays.elements_;
        pgVar31 = cliOverrides.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                  .arrays.groups_;
        pgVar7 = cliOverrides.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                 .arrays.groups_ + (long)ppVar56;
        local_b8 = pgVar7->m[0].n;
        uStack_b7 = pgVar7->m[1].n;
        uStack_b6 = pgVar7->m[2].n;
        uStack_b5 = pgVar7->m[3].n;
        uStack_b4 = pgVar7->m[4].n;
        uStack_b3 = pgVar7->m[5].n;
        uStack_b2 = pgVar7->m[6].n;
        uStack_b1 = pgVar7->m[7].n;
        uStack_b0 = pgVar7->m[8].n;
        uStack_af = pgVar7->m[9].n;
        uStack_ae = pgVar7->m[10].n;
        uStack_ad = pgVar7->m[0xb].n;
        uStack_ac = pgVar7->m[0xc].n;
        uStack_ab = pgVar7->m[0xd].n;
        uStack_aa = pgVar7->m[0xe].n;
        bVar77 = pgVar7->m[0xf].n;
        auVar68[0] = -(local_b8 == auVar80[0]);
        auVar68[1] = -(uStack_b7 == auVar80[1]);
        auVar68[2] = -(uStack_b6 == auVar80[2]);
        auVar68[3] = -(uStack_b5 == auVar80[3]);
        auVar68[4] = -(uStack_b4 == auVar80[4]);
        auVar68[5] = -(uStack_b3 == auVar80[5]);
        auVar68[6] = -(uStack_b2 == auVar80[6]);
        auVar68[7] = -(uStack_b1 == auVar80[7]);
        auVar68[8] = -(uStack_b0 == auVar80[8]);
        auVar68[9] = -(uStack_af == auVar80[9]);
        auVar68[10] = -(uStack_ae == auVar80[10]);
        auVar68[0xb] = -(uStack_ad == auVar80[0xb]);
        auVar68[0xc] = -(uStack_ac == auVar80[0xc]);
        auVar68[0xd] = -(uStack_ab == auVar80[0xd]);
        auVar68[0xe] = -(uStack_aa == auVar80[0xe]);
        auVar68[0xf] = -(bVar77 == auVar80[0xf]);
        uVar34 = (uint)(ushort)((ushort)(SUB161(auVar68 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar68 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar68 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar68 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar68 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar68 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar68 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar68 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar68 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar68 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar68 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar68 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar68 >> 0x77,0) & 1) << 0xe);
        ppVar44 = ppVar56;
        bStack_a9 = bVar77;
        if (uVar34 != 0) {
          do {
            local_2b8 = ppVar44;
            local_2c8 = auVar80;
            uVar26 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            bVar33 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                &cliOverrides,&pPVar53->name,
                                &ppVar32[(long)ppVar56 * 0xf + (ulong)uVar26].first);
            if (bVar33) goto LAB_002a5f23;
            uVar34 = uVar34 - 1 & uVar34;
            auVar80 = local_2c8;
            ppVar44 = local_2b8;
          } while (uVar34 != 0);
          bVar77 = pgVar31[(long)ppVar56].m[0xf].n;
          ppVar56 = local_2b8;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar37 & 7] & bVar77) == 0) break;
        lVar55 = uVar54 + 1;
        uVar54 = uVar54 + 1;
        ppVar56 = (pointer)((long)&(ppVar56->first).definition + lVar55 &
                           cliOverrides.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                           .arrays.groups_size_mask);
      } while (uVar54 <= cliOverrides.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                         .arrays.groups_size_mask);
    }
LAB_002a605c:
    pDVar38 = Scope::addDiag(pSVar16->parentScope,(DiagCode)0x10000d,
                             (SourceLocation)0xffffffffffffffff);
    Diagnostic::operator<<(pDVar38,arg_00);
  }
  goto LAB_002a608b;
LAB_002a5f23:
  pPVar53 = pPVar53 + 1;
  goto LAB_002a5f02;
LAB_002a5c6f:
  if (ppCVar50 != ppCVar13) {
    this_01 = *ppCVar50;
    pSVar39 = Symbol::getSourceLibrary(&this_01->super_Symbol);
    if ((pSVar39 != pSVar59) && ((pSVar59 != (SourceLibrary *)0x0 || (pSVar39->isDefault == false)))
       ) goto LAB_002a5c97;
    this_01->isUsed = true;
    sVar87 = ConfigBlockSymbol::getTopCells(this_01);
    pTVar42 = sVar87._M_ptr;
    for (lVar55 = sVar87._M_extent._M_extent_value._M_extent_value << 5; lVar55 != 0;
        lVar55 = lVar55 + -0x20) {
      result.configRoot = this_01;
      result.definition = &pTVar42->definition->super_Symbol;
      result.configRule = pTVar42->rule;
      getRoot::anon_class_24_3_d9e6786c::operator()(&tryAddTop,result,pTVar42->sourceRange);
      pTVar42 = pTVar42 + 1;
    }
    goto LAB_002a608b;
  }
  goto LAB_002a5c27;
LAB_002a5c97:
  ppCVar50 = ppCVar50 + 1;
  goto LAB_002a5c6f;
  while( true ) {
    lVar55 = uVar57 + uVar58;
    uVar58 = uVar58 + 1;
    uVar57 = lVar55 + 1U & uVar54;
    if (uVar54 < uVar58) break;
LAB_002a6a36:
    pgVar4 = (this->hierarchyOverrides).childNodes.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
             .arrays.groups_ + uVar57;
    local_118 = pgVar4->m[0].n;
    uStack_117 = pgVar4->m[1].n;
    uStack_116 = pgVar4->m[2].n;
    bStack_115 = pgVar4->m[3].n;
    uStack_114 = pgVar4->m[4].n;
    uStack_113 = pgVar4->m[5].n;
    uStack_112 = pgVar4->m[6].n;
    bStack_111 = pgVar4->m[7].n;
    uStack_110 = pgVar4->m[8].n;
    uStack_10f = pgVar4->m[9].n;
    uStack_10e = pgVar4->m[10].n;
    bStack_10d = pgVar4->m[0xb].n;
    uStack_10c = pgVar4->m[0xc].n;
    uStack_10b = pgVar4->m[0xd].n;
    uStack_10a = pgVar4->m[0xe].n;
    bStack_109 = pgVar4->m[0xf].n;
    uVar64 = (uchar)uVar8;
    auVar81[0] = -(local_118 == uVar64);
    uVar73 = (uchar)((uint)uVar8 >> 8);
    auVar81[1] = -(uStack_117 == uVar73);
    uVar75 = (uchar)((uint)uVar8 >> 0x10);
    auVar81[2] = -(uStack_116 == uVar75);
    bVar77 = (byte)((uint)uVar8 >> 0x18);
    auVar81[3] = -(bStack_115 == bVar77);
    auVar81[4] = -(uStack_114 == uVar64);
    auVar81[5] = -(uStack_113 == uVar73);
    auVar81[6] = -(uStack_112 == uVar75);
    auVar81[7] = -(bStack_111 == bVar77);
    auVar81[8] = -(uStack_110 == uVar64);
    auVar81[9] = -(uStack_10f == uVar73);
    auVar81[10] = -(uStack_10e == uVar75);
    auVar81[0xb] = -(bStack_10d == bVar77);
    auVar81[0xc] = -(uStack_10c == uVar64);
    auVar81[0xd] = -(uStack_10b == uVar73);
    auVar81[0xe] = -(uStack_10a == uVar75);
    auVar81[0xf] = -(bStack_109 == bVar77);
    for (uVar34 = (uint)(ushort)((ushort)(SUB161(auVar81 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe); uVar34 != 0;
        uVar34 = uVar34 - 1 & uVar34) {
      iVar35 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> iVar35 & 1) == 0; iVar35 = iVar35 + 1) {
        }
      }
      if (*(SyntaxNode **)((long)&ppVar21[uVar57 * 0xf].first.value + (ulong)(uint)(iVar35 << 7)) ==
          pSVar20) {
        sVar61 = (long)&ppVar21[uVar57 * 0xf].first.value + (ulong)(uint)(iVar35 << 7);
        goto LAB_002a6afb;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_109) == 0) break;
  }
  if ((this->hierarchyOverrides).childNodes.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
      .size_ctrl.size <
      (this->hierarchyOverrides).childNodes.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
              ((locator *)&topList,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                *)this_02,uVar48,hash,(try_emplace_args_t *)&tryAddTop,(Entry *)&__begin3);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
              ((locator *)&topList,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                *)this_02,hash,(try_emplace_args_t *)&tryAddTop,(Entry *)&__begin3);
  }
  sVar61 = topList.super_SmallVectorBase<const_slang::ast::InstanceSymbol_*>.cap;
LAB_002a6afb:
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)&topList,
                    (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)ppVar32[uVar47 * 0xf + (ulong)uVar26].second);
  topList.stackBase[8] = '\0';
  topList.stackBase[9] = '\0';
  topList.stackBase[10] = '\0';
  topList.stackBase[0xb] = '\0';
  topList.stackBase[0xc] = '\0';
  topList.stackBase[0xd] = '\0';
  topList.stackBase[0xe] = '\0';
  topList.stackBase[0xf] = '\0';
  pSVar22 = pSVar46->thisSym;
  __begin3_1.pc_ = (char_pointer)pSVar22;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = pSVar22;
  uVar57 = SUB168(auVar28 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar28 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar47 = uVar57 >> (*(byte *)(sVar61 + 8) & 0x3f);
  uVar8 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar57 & 0xff];
  uVar48 = 0;
  uVar54 = uVar47;
  do {
    pcVar5 = (char *)(*(long *)(sVar61 + 0x18) + uVar54 * 0x10);
    local_128 = *pcVar5;
    cStack_127 = pcVar5[1];
    cStack_126 = pcVar5[2];
    bStack_125 = pcVar5[3];
    cStack_124 = pcVar5[4];
    cStack_123 = pcVar5[5];
    cStack_122 = pcVar5[6];
    bStack_121 = pcVar5[7];
    cStack_120 = pcVar5[8];
    cStack_11f = pcVar5[9];
    cStack_11e = pcVar5[10];
    bStack_11d = pcVar5[0xb];
    cStack_11c = pcVar5[0xc];
    cStack_11b = pcVar5[0xd];
    cStack_11a = pcVar5[0xe];
    bStack_119 = pcVar5[0xf];
    cVar65 = (char)uVar8;
    auVar82[0] = -(local_128 == cVar65);
    cVar74 = (char)((uint)uVar8 >> 8);
    auVar82[1] = -(cStack_127 == cVar74);
    cVar76 = (char)((uint)uVar8 >> 0x10);
    auVar82[2] = -(cStack_126 == cVar76);
    bVar77 = (byte)((uint)uVar8 >> 0x18);
    auVar82[3] = -(bStack_125 == bVar77);
    auVar82[4] = -(cStack_124 == cVar65);
    auVar82[5] = -(cStack_123 == cVar74);
    auVar82[6] = -(cStack_122 == cVar76);
    auVar82[7] = -(bStack_121 == bVar77);
    auVar82[8] = -(cStack_120 == cVar65);
    auVar82[9] = -(cStack_11f == cVar74);
    auVar82[10] = -(cStack_11e == cVar76);
    auVar82[0xb] = -(bStack_11d == bVar77);
    auVar82[0xc] = -(cStack_11c == cVar65);
    auVar82[0xd] = -(cStack_11b == cVar74);
    auVar82[0xe] = -(cStack_11a == cVar76);
    auVar82[0xf] = -(bStack_119 == bVar77);
    uVar34 = (uint)(ushort)((ushort)(SUB161(auVar82 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe);
    if (uVar34 != 0) {
      do {
        uVar26 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        if (pSVar22 ==
            *(Symbol **)(*(long *)(sVar61 + 0x20) + uVar54 * 0x348 + (ulong)uVar26 * 0x38))
        goto LAB_002a6c26;
        uVar34 = uVar34 - 1 & uVar34;
      } while (uVar34 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar57 & 7] & bStack_119) == 0) break;
    lVar55 = uVar54 + uVar48;
    uVar48 = uVar48 + 1;
    uVar54 = lVar55 + 1U & *(ulong *)(sVar61 + 0x10);
  } while (uVar48 <= *(ulong *)(sVar61 + 0x10));
  if (*(ulong *)(sVar61 + 0x30) < *(ulong *)(sVar61 + 0x28)) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,decltype(nullptr)>>
              ((locator *)&tryAddTop,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                *)(sVar61 + 8),uVar47,uVar57,(try_emplace_args_t *)&local_2e8,
               (SyntaxNode **)&__begin3_1,(pair<slang::ConstantValue,_std::nullptr_t> *)&topList);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,decltype(nullptr)>>
              ((locator *)&tryAddTop,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                *)(sVar61 + 8),uVar57,(try_emplace_args_t *)&local_2e8,(SyntaxNode **)&__begin3_1,
               (pair<slang::ConstantValue,_std::nullptr_t> *)&topList);
  }
LAB_002a6c26:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&topList);
LAB_002a6c38:
  pSVar46 = (Scope *)&pSVar46[1].thisSym;
  goto LAB_002a6870;
}

Assistant:

const RootSymbol& Compilation::getRoot(bool skipDefParamsAndBinds) {
    if (finalized)
        return *root;

    SLANG_ASSERT(!isFrozen());

    // Resolve default lib list now that we have all syntax trees added.
    defaultLiblist.reserve(options.defaultLiblist.size());
    for (auto& libName : options.defaultLiblist) {
        if (auto lib = getSourceLibrary(libName))
            defaultLiblist.push_back(lib);
    }

    // If any top-level parameter overrides were provided, parse them now.
    flat_hash_map<std::string_view, const ConstantValue*> cliOverrides;
    parseParamOverrides(cliOverrides);

    // If there are defparams we need to fully resolve their values up front before
    // we start elaborating any instances.
    if (!skipDefParamsAndBinds) {
        for (auto& tree : syntaxTrees) {
            auto& meta = tree->getMetadata();
            if (meta.hasDefparams || meta.hasBindDirectives) {
                resolveDefParamsAndBinds();
                break;
            }
        }
    }

    SLANG_ASSERT(!finalizing);
    finalizing = true;
    auto guard = ScopeGuard([this] { finalizing = false; });

    auto isValidTop = [&](auto& definition) {
        // All parameters must have defaults.
        for (auto& param : definition.parameters) {
            if (!param.hasDefault() &&
                (param.isTypeParam || cliOverrides.find(param.name) == cliOverrides.end())) {
                return false;
            }
        }
        return true;
    };

    // Find top level modules (and programs) that form the root of the design.
    // Iterate the definitions map before instantiating any top level modules,
    // since that can cause changes to the definition map itself.
    SmallVector<std::pair<DefinitionLookupResult, SourceRange>> topDefs;
    if (options.topModules.empty()) {
        for (auto& [key, defList] : definitionMap) {
            if (std::get<1>(key) != root.get())
                continue;

            for (auto defSym : defList.first) {
                // Ignore definitions that are not top level. Top level definitions are:
                // - Modules and programs
                // - Not nested
                // - Have no non-defaulted parameters
                // - Not instantiated anywhere
                // - Not in a library
                if (defSym->kind != SymbolKind::Definition)
                    continue;

                auto& def = defSym->as<DefinitionSymbol>();
                if (!def.sourceLibrary.isDefault ||
                    globalInstantiations.find(def.name) != globalInstantiations.end()) {
                    continue;
                }

                // Library definitions are never automatically instantiated in any capacity.
                if (!def.syntaxTree || !def.syntaxTree->isLibraryUnit) {
                    if (def.definitionKind == DefinitionKind::Module ||
                        def.definitionKind == DefinitionKind::Program) {
                        if (isValidTop(def)) {
                            // This definition can be automatically instantiated.
                            topDefs.push_back({{&def}, {}});
                            continue;
                        }
                    }
                }

                // Otherwise this definition is unreferenced and not automatically instantiated.
                unreferencedDefs.push_back(&def);
            }
        }
    }
    else {
        SmallMap<std::string_view, size_t, 4> topNameMap;
        auto tryAddTop = [&](DefinitionLookupResult result, SourceRange sourceRange) {
            // Make sure this definition's name doesn't collide with a top
            // module we already previously selected.
            auto def = result.definition;
            auto [it, inserted] = topNameMap.emplace(def->name, topDefs.size());
            if (inserted) {
                topDefs.push_back({result, sourceRange});
                SLANG_ASSERT(def->kind == SymbolKind::Definition);
                def->as<DefinitionSymbol>().noteInstantiated();
            }
            else {
                auto& diag = root->addDiag(diag::MultipleTopDupName, sourceRange.start()
                                                                         ? sourceRange
                                                                         : SourceRange::NoLocation);
                diag << def->name;

                auto& entry = topDefs[it->second];
                if (entry.first.configRoot)
                    diag.addNote(diag::NoteConfigRule, entry.second);
            }
        };

        // If the list of top modules has already been provided we just need to
        // find and instantiate them.
        for (auto userProvidedName : options.topModules) {
            // Find the target library, if there is one specified.
            auto searchName = userProvidedName;
            const SourceLibrary* targetLib = nullptr;
            if (auto idx = searchName.find('.'); idx != std::string_view::npos) {
                targetLib = getSourceLibrary(searchName.substr(0, idx));
                if (!targetLib) {
                    root->addDiag(diag::InvalidTopModule, SourceLocation::NoLocation)
                        << userProvidedName;
                    continue;
                }

                searchName = searchName.substr(idx + 1);
            }

            // A trailing ':config' is stripped -- it's there to allow the user
            // to disambiguate modules and config blocks.
            bool onlyConfig = false;
            constexpr std::string_view configSuffix = ":config";
            if (searchName.ends_with(configSuffix)) {
                onlyConfig = true;
                searchName = searchName.substr(0, searchName.length() - configSuffix.length());
            }

            if (!onlyConfig) {
                if (auto defIt = definitionMap.find(std::tuple{searchName, root.get()});
                    defIt != definitionMap.end()) {

                    const DefinitionSymbol* foundDef = nullptr;
                    for (auto defSym : defIt->second.first) {
                        if (defSym->kind != SymbolKind::Definition)
                            continue;

                        auto& def = defSym->as<DefinitionSymbol>();
                        if (&def.sourceLibrary == targetLib ||
                            (!targetLib && def.sourceLibrary.isDefault)) {
                            foundDef = &def;
                            break;
                        }
                    }

                    if (foundDef) {
                        if ((foundDef->definitionKind == DefinitionKind::Module ||
                             foundDef->definitionKind == DefinitionKind::Program) &&
                            isValidTop(*foundDef)) {

                            tryAddTop({foundDef}, {});
                        }
                        else {
                            // Otherwise, issue an error because the user asked us to instantiate
                            // this.
                            foundDef->getParentScope()->addDiag(diag::InvalidTopModule,
                                                                SourceLocation::NoLocation)
                                << userProvidedName;
                        }
                        continue;
                    }
                }
            }

            if (auto confIt = configBlocks.find(searchName); confIt != configBlocks.end()) {
                const ConfigBlockSymbol* foundConf = nullptr;
                for (auto conf : confIt->second) {
                    auto lib = conf->getSourceLibrary();
                    SLANG_ASSERT(lib);

                    if (lib == targetLib || (!targetLib && lib->isDefault)) {
                        foundConf = conf;
                        break;
                    }
                }

                if (foundConf) {
                    foundConf->isUsed = true;
                    for (auto& cell : foundConf->getTopCells())
                        tryAddTop({&cell.definition, foundConf, cell.rule}, cell.sourceRange);
                    continue;
                }
            }

            root->addDiag(diag::InvalidTopModule, SourceLocation::NoLocation) << userProvidedName;
        }

        // Go back through the definition map and find all definitions that are unused,
        // unreferenced in the design, and candidates for instantiating in unreferenced
        // form to get some error checking of their contents.
        for (auto& [key, defList] : definitionMap) {
            if (std::get<1>(key) != root.get())
                continue;

            for (auto defSym : defList.first) {
                if (defSym->kind != SymbolKind::Definition)
                    continue;

                auto& def = defSym->as<DefinitionSymbol>();
                if (globalInstantiations.find(def.name) == globalInstantiations.end() &&
                    def.sourceLibrary.isDefault && def.getInstanceCount() == 0) {
                    unreferencedDefs.push_back(&def);
                }
            }
        }
    }

    // Sort the list of definitions so that we get deterministic ordering of instances;
    // the order is otherwise dependent on iterating over a hash table.
    std::ranges::sort(topDefs, [](auto a, auto b) {
        return a.first.definition->name < b.first.definition->name;
    });
    std::ranges::sort(unreferencedDefs, [](auto a, auto b) { return a->name < b->name; });

    // If we have any cli param overrides we should apply them to
    // each top-level instance.
    // TODO: generalize these to full hierarchical paths
    if (!cliOverrides.empty()) {
        for (auto [result, _] : topDefs) {
            auto& def = result.definition->as<DefinitionSymbol>();
            for (auto& param : def.parameters) {
                if (!param.isTypeParam && param.hasSyntax) {
                    auto it = cliOverrides.find(param.name);
                    if (it != cliOverrides.end()) {
                        hierarchyOverrides.childNodes[*def.getSyntax()].paramOverrides.emplace(
                            param.valueDecl, std::pair{*it->second, nullptr});
                    }
                }
            }
        }
    }

    SmallVector<const InstanceSymbol*> topList;
    for (auto [result, _] : topDefs) {
        auto& def = result.definition->as<DefinitionSymbol>();
        HierarchyOverrideNode* hierarchyOverrideNode = nullptr;
        if (auto sit = hierarchyOverrides.childNodes.find(*def.getSyntax());
            sit != hierarchyOverrides.childNodes.end()) {
            hierarchyOverrideNode = &sit->second;
        }

        auto& instance = InstanceSymbol::createDefault(*this, def, hierarchyOverrideNode,
                                                       result.configRoot, result.configRule);
        root->addMember(instance);
        topList.push_back(&instance);
    }

    if (!hasFlag(CompilationFlags::LintMode | CompilationFlags::AllowTopLevelIfacePorts) &&
        topDefs.empty()) {
        root->addDiag(diag::NoTopModules, SourceLocation::NoLocation);
    }

    // For unreferenced definitions, go through and instantiate them with all empty
    // parameter values so that we get at least some semantic checking of the contents.
    for (auto def : unreferencedDefs)
        root->addMember(InstanceSymbol::createInvalid(*this, *def));

    root->topInstances = topList.copy(*this);
    root->compilationUnits = compilationUnits;
    finalizing = false;
    finalized = true;

    return *root;
}